

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O0

void __thiscall
linq::
GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_bool,_int>
::Init(GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>
       *this)

{
  bool bVar1;
  mapped_type *this_00;
  iterator iVar2;
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
  *this_01;
  key_type_conflict local_c5;
  int local_c4;
  int *local_c0;
  int *x;
  undefined1 local_78 [8];
  iterator __end0;
  iterator __begin0;
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
  *__range2;
  GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>
  *this_local;
  
  this_01 = &this->source;
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
  ::Init(this_01);
  std::
  map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&this->result);
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
  ::begin((iterator *)&__end0.valid,this_01);
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
  ::end((iterator *)local_78,this_01);
  while( true ) {
    IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
    ::iterator::iterator((iterator *)&x,(iterator *)local_78);
    bVar1 = IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
            ::iterator::operator!=((iterator *)&__end0.valid,(iterator *)&x);
    IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
    ::iterator::~iterator((iterator *)&x);
    if (!bVar1) break;
    local_c4 = IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
               ::iterator::operator*((iterator *)&__end0.valid);
    local_c0 = &local_c4;
    local_c5 = std::function<bool_(const_int_&)>::operator()(&this->transformer,local_c0);
    this_00 = std::
              map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->result,&local_c5);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,local_c0);
    IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
    ::iterator::operator++((iterator *)&__end0.valid);
  }
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
  ::iterator::~iterator((iterator *)local_78);
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
  ::iterator::~iterator((iterator *)&__end0.valid);
  iVar2 = std::
          map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::begin(&this->result);
  (this->current)._M_node = iVar2._M_node;
  return;
}

Assistant:

void Init() override 
			{
				source.Init();
				result.clear();
				
				for(const auto& x : source)
					result[transformer(x)].push_back(x);
				
				current = result.begin();
			}